

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ect.cc
# Opt level: O1

base_learner * ect_setup(options_i *options,vw *all)

{
  parser *ppVar1;
  vw *pvVar2;
  int iVar3;
  ect *e;
  option_group_definition *poVar4;
  typed_option<unsigned_long> *ptVar5;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ptVar6;
  size_t ws;
  base_learner *l;
  single_learner *base;
  learner<ect,_example> *plVar7;
  long lVar8;
  undefined **ppuVar9;
  label_parser *plVar10;
  byte bVar11;
  size_type __dnew_3;
  string link;
  option_group_definition new_options;
  size_type __dnew;
  size_type __dnew_2;
  size_type __dnew_1;
  _func_int ***local_558;
  _func_int **local_550;
  _func_int **local_548 [2];
  vw *local_538;
  long local_530;
  _func_int ***local_528;
  _func_int **local_520;
  _func_int **local_518 [2];
  _func_int ***local_508;
  _func_int **local_500;
  _func_int **local_4f8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  string local_4c8;
  string local_4a8;
  option_group_definition local_488;
  long *local_450;
  long local_448;
  long local_440 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_430;
  string local_410;
  undefined1 local_3f0 [112];
  bool local_380;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_368;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_358;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_350;
  typed_option<unsigned_long> local_2b0;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_210;
  typed_option<unsigned_long> local_170;
  typed_option<unsigned_long> local_d0;
  
  bVar11 = 0;
  e = calloc_or_throw<ect>(1);
  memset(e,0,0xe8);
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  local_4e8._M_string_length = 0;
  local_4e8.field_2._M_local_buf[0] = '\0';
  local_3f0._0_8_ = (_func_int **)0x23;
  local_558 = local_548;
  local_558 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_558,(ulong)local_3f0);
  local_548[0] = (_func_int **)local_3f0._0_8_;
  local_558[2] = (_func_int **)0x6d616e72756f5420;
  local_558[3] = (_func_int **)0x6974704f20746e65;
  *(undefined4 *)local_558 = 0x6f727245;
  builtin_strncpy((char *)((long)local_558 + 4),"r Co",4);
  *(undefined4 *)(local_558 + 1) = 0x63657272;
  builtin_strncpy((char *)((long)local_558 + 0xc),"ting",4);
  builtin_strncpy((char *)((long)local_558 + 0x1f),"ions",4);
  local_550 = (_func_int **)local_3f0._0_8_;
  *(char *)((long)local_558 + local_3f0._0_8_) = '\0';
  local_488.m_name._M_dataplus._M_p = (pointer)&local_488.m_name.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_488,local_558,(char *)(local_3f0._0_8_ + (long)local_558));
  local_488.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_488.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_488.m_options.
  super__Vector_base<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (local_558 != local_548) {
    operator_delete(local_558);
  }
  local_4a8._M_dataplus._M_p = (pointer)&local_4a8.field_2;
  local_4a8.field_2._M_allocated_capacity._0_4_ = 0x746365;
  local_4a8._M_string_length = 3;
  VW::config::typed_option<unsigned_long>::typed_option
            ((typed_option<unsigned_long> *)local_3f0,&local_4a8,&e->k);
  local_380 = true;
  local_508 = local_4f8;
  local_2b0.super_base_option._vptr_base_option = (_func_int **)0x2b;
  local_508 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_508,(ulong)&local_2b0);
  local_4f8[0] = local_2b0.super_base_option._vptr_base_option;
  builtin_strncpy((char *)((long)local_508 + 0x1b)," with <k",8);
  builtin_strncpy((char *)((long)local_508 + 0x23),"> labels",8);
  local_508[2] = (_func_int **)0x6d616e72756f7420;
  local_508[3] = (_func_int **)0x6874697720746e65;
  *local_508 = (_func_int **)0x6f6320726f727245;
  local_508[1] = (_func_int **)0x676e697463657272;
  local_500 = local_2b0.super_base_option._vptr_base_option;
  *(char *)((long)local_508 + (long)local_2b0.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)(local_3f0 + 0x30));
  VW::config::typed_option<unsigned_long>::typed_option
            (&local_d0,(typed_option<unsigned_long> *)local_3f0);
  poVar4 = VW::config::option_group_definition::add<unsigned_long>(&local_488,&local_d0);
  local_4c8._M_dataplus._M_p = (pointer)&local_4c8.field_2;
  local_4c8.field_2._M_allocated_capacity._0_4_ = 0x6f727265;
  local_4c8.field_2._M_allocated_capacity._4_2_ = 0x72;
  local_4c8._M_string_length = 5;
  VW::config::typed_option<unsigned_long>::typed_option(&local_2b0,&local_4c8,&e->errors);
  local_2b0.super_base_option.m_keep = true;
  ptVar5 = VW::config::typed_option<unsigned_long>::default_value(&local_2b0,0);
  local_528 = local_518;
  local_350.super_base_option._vptr_base_option = (_func_int **)0x15;
  local_528 = (_func_int ***)std::__cxx11::string::_M_create((ulong *)&local_528,(ulong)&local_350);
  local_518[0] = local_350.super_base_option._vptr_base_option;
  *local_528 = (_func_int **)0x612073726f727265;
  local_528[1] = (_func_int **)0x62206465776f6c6c;
  builtin_strncpy((char *)((long)local_528 + 0xd),"d by ECT",8);
  local_520 = local_350.super_base_option._vptr_base_option;
  *(char *)((long)local_528 + (long)local_350.super_base_option._vptr_base_option) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar5->super_base_option).m_help);
  VW::config::typed_option<unsigned_long>::typed_option(&local_170,ptVar5);
  local_538 = all;
  poVar4 = VW::config::option_group_definition::add<unsigned_long>(poVar4,&local_170);
  local_410.field_2._M_allocated_capacity._0_4_ = 0x6b6e696c;
  local_410._M_string_length = 4;
  local_410.field_2._M_local_buf[4] = '\0';
  local_410._M_dataplus._M_p = (pointer)&local_410.field_2;
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_350,&local_410,&local_4e8);
  local_430.field_2._M_allocated_capacity = 0x797469746e656469;
  local_430._M_string_length = 8;
  local_430.field_2._M_local_buf[8] = '\0';
  local_430._M_dataplus._M_p = (pointer)&local_430.field_2;
  ptVar6 = VW::config::
           typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::default_value(&local_350,&local_430);
  (ptVar6->super_base_option).m_keep = true;
  local_530 = 0x3e;
  local_450 = local_440;
  local_450 = (long *)std::__cxx11::string::_M_create((ulong *)&local_450,(ulong)&local_530);
  local_440[0] = local_530;
  builtin_strncpy((char *)((long)local_450 + 0x2e)," glf1 or",8);
  builtin_strncpy((char *)((long)local_450 + 0x36)," poisson",8);
  local_450[4] = 0x676f6c202c797469;
  local_450[5] = 0x67202c6369747369;
  local_450[2] = 0x6f6974636e756620;
  local_450[3] = 0x746e656469203a6e;
  *local_450 = 0x2079666963657053;
  local_450[1] = 0x6b6e696c20656874;
  local_448 = local_530;
  *(char *)((long)local_450 + local_530) = '\0';
  std::__cxx11::string::_M_assign((string *)&(ptVar6->super_base_option).m_help);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  typed_option(&local_210,ptVar6);
  VW::config::option_group_definition::add<std::__cxx11::string>(poVar4,&local_210);
  local_210.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb018;
  if (local_210.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_210.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_210.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_210.super_base_option);
  if (local_450 != local_440) {
    operator_delete(local_450);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_430._M_dataplus._M_p != &local_430.field_2) {
    operator_delete(local_430._M_dataplus._M_p);
  }
  local_350.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb018;
  if (local_350.m_default_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_default_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  if (local_350.m_value.
      super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_350.m_value.
               super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_350.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_410._M_dataplus._M_p != &local_410.field_2) {
    operator_delete(local_410._M_dataplus._M_p);
  }
  local_170.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb050;
  if (local_170.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_170.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_170.super_base_option);
  if (local_528 != local_518) {
    operator_delete(local_528);
  }
  local_2b0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb050;
  if (local_2b0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_2b0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_2b0.super_base_option);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c8._M_dataplus._M_p != &local_4c8.field_2) {
    operator_delete(local_4c8._M_dataplus._M_p);
  }
  local_d0.super_base_option._vptr_base_option = (_func_int **)&PTR__typed_option_002cb050;
  if (local_d0.m_default_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_default_value.
               super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  if (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d0.m_value.super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  VW::config::base_option::~base_option(&local_d0.super_base_option);
  if (local_508 != local_4f8) {
    operator_delete(local_508);
  }
  local_3f0._0_8_ = &PTR__typed_option_002cb050;
  if (local_358._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_358._M_pi);
  }
  if (local_368._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_368._M_pi);
  }
  VW::config::base_option::~base_option((base_option *)local_3f0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4a8._M_dataplus._M_p != &local_4a8.field_2) {
    operator_delete(local_4a8._M_dataplus._M_p);
  }
  (**options->_vptr_options_i)(options,&local_488);
  local_3f0._16_4_ = 0x746365;
  local_3f0._8_8_ = (pointer)0x3;
  local_3f0._0_8_ = local_3f0 + 0x10;
  iVar3 = (*options->_vptr_options_i[1])(options,local_3f0);
  if ((undefined1 *)local_3f0._0_8_ != local_3f0 + 0x10) {
    operator_delete((void *)local_3f0._0_8_);
  }
  if ((char)iVar3 == '\0') {
    plVar7 = (learner<ect,_example> *)0x0;
  }
  else {
    ws = create_circuit(e,e->k,e->errors + 1);
    pvVar2 = local_538;
    l = setup_base(options,local_538);
    iVar3 = std::__cxx11::string::compare((char *)&local_4e8);
    if (iVar3 == 0) {
      e->class_boundary = 0.5;
    }
    base = LEARNER::as_singleline<char,char>(l);
    ppVar1 = pvVar2->p;
    plVar7 = LEARNER::learner<ect,example>::init_learner<LEARNER::learner<char,example>>
                       (e,base,learn,predict,ws,multiclass);
    *(undefined8 *)(plVar7 + 0x58) = *(undefined8 *)(plVar7 + 0x18);
    *(code **)(plVar7 + 0x68) = MULTICLASS::finish_example<ect>;
    ppuVar9 = &MULTICLASS::mc_label;
    plVar10 = &ppVar1->lp;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      plVar10->default_label = (_func_void_void_ptr *)*ppuVar9;
      ppuVar9 = ppuVar9 + (ulong)bVar11 * -2 + 1;
      plVar10 = (label_parser *)((long)plVar10 + (ulong)bVar11 * -0x10 + 8);
    }
    *(undefined8 *)(plVar7 + 0xb8) = *(undefined8 *)(plVar7 + 0x18);
    *(undefined8 *)(plVar7 + 0xc0) = *(undefined8 *)(plVar7 + 0x20);
    *(code **)(plVar7 + 200) = finish;
    e = (ect *)0x0;
  }
  std::
  vector<std::shared_ptr<VW::config::base_option>,_std::allocator<std::shared_ptr<VW::config::base_option>_>_>
  ::~vector(&local_488.m_options);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_488.m_name._M_dataplus._M_p != &local_488.m_name.field_2) {
    operator_delete(local_488.m_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
    operator_delete(local_4e8._M_dataplus._M_p);
  }
  if (e != (ect *)0x0) {
    free(e);
  }
  return (base_learner *)plVar7;
}

Assistant:

base_learner* ect_setup(options_i& options, vw& all)
{
  auto data = scoped_calloc_or_throw<ect>();
  std::string link;
  option_group_definition new_options("Error Correcting Tournament Options");
  new_options.add(make_option("ect", data->k).keep().help("Error correcting tournament with <k> labels"))
      .add(make_option("error", data->errors).keep().default_value(0).help("errors allowed by ECT"))
      // Used to check value. TODO replace
      .add(make_option("link", link)
               .default_value("identity")
               .keep()
               .help("Specify the link function: identity, logistic, glf1 or poisson"));
  options.add_and_parse(new_options);

  if (!options.was_supplied("ect"))
    return nullptr;

  size_t wpp = create_circuit(*data.get(), data->k, data->errors + 1);

  base_learner* base = setup_base(options, all);
  if (link.compare("logistic") == 0)
    data->class_boundary = 0.5;  // as --link=logistic maps predictions in [0;1]

  learner<ect, example>& l = init_multiclass_learner(data, as_singleline(base), learn, predict, all.p, wpp);
  l.set_finish(finish);

  return make_base(l);
}